

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int skill_training_percent(int skill)

{
  ushort uVar1;
  int iVar2;
  int local_30;
  int local_28;
  int partial;
  int mintrain;
  int i;
  int percent;
  int skill_local;
  
  mintrain = 0;
  if (u.weapon_skills[skill].skill == '\0') {
    percent = 0;
  }
  else {
    for (partial = (int)u.weapon_skills[skill].skill; partial < u.weapon_skills[skill].max_skill;
        partial = partial + 1) {
      uVar1 = u.weapon_skills[skill].advance;
      iVar2 = practice_needed_to_advance(skill,partial);
      if ((int)(uint)uVar1 < iVar2) {
        if (partial == 1) {
          local_28 = 0;
        }
        else {
          local_28 = practice_needed_to_advance(skill,partial + -1);
        }
        uVar1 = u.weapon_skills[skill].advance;
        iVar2 = practice_needed_to_advance(skill,partial);
        local_30 = (int)(((uint)uVar1 - local_28) * 100) / (iVar2 - local_28);
        if (99 < local_30) {
          local_30 = 100;
        }
        mintrain = local_30 + mintrain;
        break;
      }
      mintrain = mintrain + 100;
    }
    percent = mintrain;
  }
  return percent;
}

Assistant:

static int skill_training_percent(int skill)
{
    int percent = 0;
    int i;

    if (P_RESTRICTED(skill))
	return 0;

    for (i = P_SKILL(skill); i < P_MAX_SKILL(skill); i++) {
	if (P_ADVANCE(skill) >= practice_needed_to_advance(skill, i)) {
	    percent += 100;
	} else {
	    int mintrain = (i == P_UNSKILLED) ? 0 :
			   practice_needed_to_advance(skill, i - 1);
	    int partial = (P_ADVANCE(skill) - mintrain) * 100 /
			  (practice_needed_to_advance(skill, i) - mintrain);
	    percent += min(partial, 100);
	    break;
	}
    }

    return percent;
}